

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall capnp::_::PointerBuilder::setBlob<capnp::Text>(PointerBuilder *this,Reader value)

{
  undefined1 auVar1 [16];
  SegmentBuilder *in_stack_ffffffffffffffb0;
  PointerBuilder *this_local;
  Reader value_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_ffffffffffffffb0;
  WireHelpers::setTextPointer
            ((SegmentAnd<capnp::Text::Builder> *)&stack0xffffffffffffffb0,
             (WireHelpers *)this->pointer,(WirePointer *)this->segment,
             (SegmentBuilder *)this->capTable,value.super_StringPtr.content.ptr,
             (Reader)(auVar1 << 0x40),value.super_StringPtr.content.size_);
  return;
}

Assistant:

void PointerBuilder::setBlob<Text>(Text::Reader value) {
  WireHelpers::setTextPointer(pointer, segment, capTable, value);
}